

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlAttrPtr xmlGetPropNodeInternal(xmlNode *node,xmlChar *name,xmlChar *nsName,int useDTD)

{
  long lVar1;
  long lVar2;
  _xmlDoc *p_Var3;
  int iVar4;
  xmlChar *pxVar5;
  xmlNsPtr *ppxVar6;
  xmlNsPtr *local_68;
  xmlNsPtr *cur;
  xmlNsPtr *nsList;
  xmlChar *tmpstr;
  xmlChar *elemQName;
  xmlAttributePtr attrDecl;
  xmlDocPtr doc;
  xmlAttrPtr prop;
  int useDTD_local;
  xmlChar *nsName_local;
  xmlChar *name_local;
  xmlNode *node_local;
  
  if (((node != (xmlNode *)0x0) && (node->type == XML_ELEMENT_NODE)) && (name != (xmlChar *)0x0)) {
    if (node->properties != (_xmlAttr *)0x0) {
      doc = (xmlDocPtr)node->properties;
      if (nsName == (xmlChar *)0x0) {
        do {
          lVar1._0_4_ = doc->compression;
          lVar1._4_4_ = doc->standalone;
          if ((lVar1 == 0) && (iVar4 = xmlStrEqual((xmlChar *)doc->name,name), iVar4 != 0)) {
            return (xmlAttrPtr)doc;
          }
          doc = (xmlDocPtr)doc->next;
        } while (doc != (xmlDocPtr)0x0);
      }
      else {
        do {
          lVar2._0_4_ = doc->compression;
          lVar2._4_4_ = doc->standalone;
          if (((lVar2 != 0) && (iVar4 = xmlStrEqual((xmlChar *)doc->name,name), iVar4 != 0)) &&
             ((*(xmlChar **)(*(long *)&doc->compression + 0x10) == nsName ||
              (iVar4 = xmlStrEqual(*(xmlChar **)(*(long *)&doc->compression + 0x10),nsName),
              iVar4 != 0)))) {
            return (xmlAttrPtr)doc;
          }
          doc = (xmlDocPtr)doc->next;
        } while (doc != (xmlDocPtr)0x0);
      }
    }
    if (((useDTD != 0) && (node->doc != (_xmlDoc *)0x0)) && (node->doc->intSubset != (_xmlDtd *)0x0)
       ) {
      p_Var3 = node->doc;
      elemQName = (xmlChar *)0x0;
      nsList = (xmlNsPtr *)0x0;
      if ((node->ns == (xmlNs *)0x0) || (node->ns->prefix == (xmlChar *)0x0)) {
        tmpstr = node->name;
      }
      else {
        pxVar5 = xmlStrdup(node->ns->prefix);
        pxVar5 = xmlStrcat(pxVar5,":");
        nsList = (xmlNsPtr *)xmlStrcat(pxVar5,node->name);
        tmpstr = (xmlChar *)nsList;
        if (nsList == (xmlNsPtr *)0x0) {
          return (xmlAttrPtr)0x0;
        }
      }
      if (nsName == (xmlChar *)0x0) {
        elemQName = (xmlChar *)xmlGetDtdQAttrDesc(p_Var3->intSubset,tmpstr,name,(xmlChar *)0x0);
        if (((xmlAttributePtr)elemQName == (xmlAttributePtr)0x0) &&
           (p_Var3->extSubset != (_xmlDtd *)0x0)) {
          elemQName = (xmlChar *)xmlGetDtdQAttrDesc(p_Var3->extSubset,tmpstr,name,(xmlChar *)0x0);
        }
      }
      else {
        ppxVar6 = xmlGetNsList(node->doc,node);
        local_68 = ppxVar6;
        if (ppxVar6 == (xmlNsPtr *)0x0) {
          if (nsList != (xmlNsPtr *)0x0) {
            (*xmlFree)(nsList);
          }
          return (xmlAttrPtr)0x0;
        }
        while ((*local_68 != (xmlNsPtr)0x0 &&
               ((iVar4 = xmlStrEqual((*local_68)->href,nsName), iVar4 == 0 ||
                ((elemQName = (xmlChar *)
                              xmlGetDtdQAttrDesc(p_Var3->intSubset,tmpstr,name,(*local_68)->prefix),
                 (xmlAttributePtr)elemQName == (xmlAttributePtr)0x0 &&
                 ((p_Var3->extSubset == (_xmlDtd *)0x0 ||
                  (elemQName = (xmlChar *)
                               xmlGetDtdQAttrDesc(p_Var3->extSubset,tmpstr,name,(*local_68)->prefix)
                  , (xmlAttributePtr)elemQName == (xmlAttributePtr)0x0))))))))) {
          local_68 = local_68 + 1;
        }
        (*xmlFree)(ppxVar6);
      }
      if (nsList != (xmlNsPtr *)0x0) {
        (*xmlFree)(nsList);
      }
      if ((elemQName != (xmlChar *)0x0) && (*(long *)(elemQName + 0x58) != 0)) {
        return (xmlAttrPtr)elemQName;
      }
    }
  }
  return (xmlAttrPtr)0x0;
}

Assistant:

static xmlAttrPtr
xmlGetPropNodeInternal(const xmlNode *node, const xmlChar *name,
		       const xmlChar *nsName, int useDTD)
{
    xmlAttrPtr prop;

    if ((node == NULL) || (node->type != XML_ELEMENT_NODE) || (name == NULL))
	return(NULL);

    if (node->properties != NULL) {
	prop = node->properties;
	if (nsName == NULL) {
	    /*
	    * We want the attr to be in no namespace.
	    */
	    do {
		if ((prop->ns == NULL) && xmlStrEqual(prop->name, name)) {
		    return(prop);
		}
		prop = prop->next;
	    } while (prop != NULL);
	} else {
	    /*
	    * We want the attr to be in the specified namespace.
	    */
	    do {
		if ((prop->ns != NULL) && xmlStrEqual(prop->name, name) &&
		    ((prop->ns->href == nsName) ||
		     xmlStrEqual(prop->ns->href, nsName)))
		{
		    return(prop);
		}
		prop = prop->next;
	    } while (prop != NULL);
	}
    }

#ifdef LIBXML_TREE_ENABLED
    if (! useDTD)
	return(NULL);
    /*
     * Check if there is a default/fixed attribute declaration in
     * the internal or external subset.
     */
    if ((node->doc != NULL) && (node->doc->intSubset != NULL)) {
	xmlDocPtr doc = node->doc;
	xmlAttributePtr attrDecl = NULL;
	xmlChar *elemQName, *tmpstr = NULL;

	/*
	* We need the QName of the element for the DTD-lookup.
	*/
	if ((node->ns != NULL) && (node->ns->prefix != NULL)) {
	    tmpstr = xmlStrdup(node->ns->prefix);
	    tmpstr = xmlStrcat(tmpstr, BAD_CAST ":");
	    tmpstr = xmlStrcat(tmpstr, node->name);
	    if (tmpstr == NULL)
		return(NULL);
	    elemQName = tmpstr;
	} else
	    elemQName = (xmlChar *) node->name;
	if (nsName == NULL) {
	    /*
	    * The common and nice case: Attr in no namespace.
	    */
	    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset,
		elemQName, name, NULL);
	    if ((attrDecl == NULL) && (doc->extSubset != NULL)) {
		attrDecl = xmlGetDtdQAttrDesc(doc->extSubset,
		    elemQName, name, NULL);
	    }
	} else {
	    xmlNsPtr *nsList, *cur;

	    /*
	    * The ugly case: Search using the prefixes of in-scope
	    * ns-decls corresponding to @nsName.
	    */
	    nsList = xmlGetNsList(node->doc, node);
	    if (nsList == NULL) {
		if (tmpstr != NULL)
		    xmlFree(tmpstr);
		return(NULL);
	    }
	    cur = nsList;
	    while (*cur != NULL) {
		if (xmlStrEqual((*cur)->href, nsName)) {
		    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, elemQName,
			name, (*cur)->prefix);
		    if (attrDecl)
			break;
		    if (doc->extSubset != NULL) {
			attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, elemQName,
			    name, (*cur)->prefix);
			if (attrDecl)
			    break;
		    }
		}
		cur++;
	    }
	    xmlFree(nsList);
	}
	if (tmpstr != NULL)
	    xmlFree(tmpstr);
	/*
	* Only default/fixed attrs are relevant.
	*/
	if ((attrDecl != NULL) && (attrDecl->defaultValue != NULL))
	    return((xmlAttrPtr) attrDecl);
    }
#endif /* LIBXML_TREE_ENABLED */
    return(NULL);
}